

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_exception.hpp
# Opt level: O0

string * __thiscall
iutest::detail::FormatCxxException_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,char *description)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  iu_stringstream strm;
  char *description_local;
  
  strm._384_8_ = this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  if (strm._384_8_ == 0) {
    std::operator<<((ostream *)&strm.field_0x8,"Unknown C++ exception");
  }
  else {
    poVar1 = std::operator<<((ostream *)&strm.field_0x8,"C++ exception with description \"");
    poVar1 = std::operator<<(poVar1,(char *)strm._384_8_);
    std::operator<<(poVar1,"\"");
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatCxxException(const char* description)
{
    iu_stringstream strm;
    if( description != NULL )
    {
        strm << "C++ exception with description \"" << description << "\"";
    }
    else
    {
        strm << "Unknown C++ exception";
    }
    return strm.str();
}